

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingScanPartial<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::uhugeint_t>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  idx_t iVar1;
  hugeint_t frame_of_reference;
  hugeint_t previous_value;
  BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t> *pBVar2;
  hugeint_t *phVar3;
  ulong uVar4;
  unsigned_long uVar5;
  ulong in_RDX;
  long in_R8;
  hugeint_t hVar6;
  hugeint_t *current_result_ptr;
  data_ptr_t decompression_group_start_pointer;
  data_ptr_t current_position_ptr;
  idx_t to_scan;
  idx_t multiplier;
  idx_t i;
  hugeint_t *target_ptr;
  idx_t to_scan_2;
  idx_t remaining_1;
  hugeint_t *end;
  hugeint_t *begin;
  idx_t to_scan_1;
  idx_t remaining;
  idx_t offset_in_compression_group;
  idx_t scanned;
  bool skip_sign_extend;
  hugeint_t *result_data;
  BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t> *scan_state;
  uhugeint_t *in_stack_fffffffffffffea8;
  uhugeint_t *in_stack_fffffffffffffeb0;
  hugeint_t in_stack_fffffffffffffeb8;
  uint64_t in_stack_fffffffffffffec8;
  size_t in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  VectorType vector_type_p;
  hugeint_t *data;
  Vector *in_stack_fffffffffffffee0;
  uint64_t uVar7;
  hugeint_t *src;
  uhugeint_t local_e8;
  uhugeint_t local_d8;
  uhugeint_t in_stack_ffffffffffffff38;
  uint64_t local_a8;
  int64_t local_a0;
  ulong local_90;
  ulong local_48;
  
  vector_type_p = (VectorType)((ulong)in_stack_fffffffffffffed8 >> 0x38);
  unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>::
  operator->((unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
              *)in_stack_fffffffffffffeb0);
  pBVar2 = SegmentScanState::Cast<duckdb::BitpackingScanState<duckdb::hugeint_t,duckdb::hugeint_t>>
                     ((SegmentScanState *)in_stack_fffffffffffffeb0);
  phVar3 = FlatVector::GetData<duckdb::hugeint_t>((Vector *)0xa9ae2d);
  Vector::SetVectorType(in_stack_fffffffffffffee0,vector_type_p);
  local_48 = 0;
  while (local_48 < in_RDX) {
    if (pBVar2->current_group_offset == 0x800) {
      BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t>::LoadNextGroup
                ((BitpackingScanState<duckdb::hugeint_t,_duckdb::hugeint_t> *)
                 in_stack_ffffffffffffff38.upper);
    }
    uVar4 = pBVar2->current_group_offset & 0x1f;
    if ((pBVar2->current_group).mode == CONSTANT) {
      uVar5 = MinValue<unsigned_long>(in_RDX - local_48,0x800 - pBVar2->current_group_offset);
      ::std::fill<duckdb::hugeint_t*,duckdb::hugeint_t>
                ((hugeint_t *)in_stack_fffffffffffffeb0,(hugeint_t *)in_stack_fffffffffffffea8,
                 (hugeint_t *)0xa9af72);
      local_48 = uVar5 + local_48;
      pBVar2->current_group_offset = uVar5 + pBVar2->current_group_offset;
    }
    else if ((pBVar2->current_group).mode == CONSTANT_DELTA) {
      uVar5 = MinValue<unsigned_long>(in_RDX - local_48,0x800 - pBVar2->current_group_offset);
      for (local_90 = 0; local_90 < uVar5; local_90 = local_90 + 1) {
        iVar1 = pBVar2->current_group_offset;
        local_d8 = hugeint_t::operator_cast_to_uhugeint_t((hugeint_t *)0xa9b086);
        uhugeint_t::uhugeint_t(&local_e8,iVar1 + local_90);
        in_stack_ffffffffffffff38 =
             uhugeint_t::operator*(in_stack_fffffffffffffea8,(uhugeint_t *)0xa9b0ba);
        hugeint_t::operator_cast_to_uhugeint_t((hugeint_t *)0xa9b0de);
        uhugeint_t::operator+(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
        hVar6 = uhugeint_t::operator_cast_to_hugeint_t((uhugeint_t *)0xa9b117);
        local_a8 = hVar6.lower;
        phVar3[in_R8 + local_48 + local_90].lower = local_a8;
        local_a0 = hVar6.upper;
        phVar3[in_R8 + local_48 + local_90].upper = local_a0;
      }
      local_48 = uVar5 + local_48;
      pBVar2->current_group_offset = uVar5 + pBVar2->current_group_offset;
    }
    else {
      uVar5 = MinValue<unsigned_long>(in_RDX - local_48,0x20 - uVar4);
      src = phVar3 + in_R8 + local_48;
      if ((uVar5 == 0x20) && (uVar4 == 0)) {
        data_ptr_cast<duckdb::hugeint_t>(src);
        BitpackingPrimitives::UnPackBlock<duckdb::hugeint_t>
                  ((data_ptr_t)in_stack_fffffffffffffeb0,(data_ptr_t)in_stack_fffffffffffffea8,'\0',
                   false);
      }
      else {
        data_ptr_cast<duckdb::hugeint_t>(pBVar2->decompression_buffer);
        BitpackingPrimitives::UnPackBlock<duckdb::hugeint_t>
                  ((data_ptr_t)in_stack_fffffffffffffeb0,(data_ptr_t)in_stack_fffffffffffffea8,'\0',
                   false);
        memcpy(src,pBVar2->decompression_buffer + uVar4,uVar5 << 4);
      }
      if ((pBVar2->current_group).mode == DELTA_FOR) {
        data = (hugeint_t *)(pBVar2->current_frame_of_reference).lower;
        uVar7 = (pBVar2->current_frame_of_reference).upper;
        frame_of_reference.upper = in_stack_fffffffffffffed0;
        frame_of_reference.lower = in_stack_fffffffffffffec8;
        ApplyFrameOfReference<duckdb::hugeint_t>
                  ((hugeint_t *)in_stack_fffffffffffffeb8.upper,frame_of_reference,
                   in_stack_fffffffffffffeb8.lower);
        in_stack_fffffffffffffec8 = (pBVar2->current_delta_offset).lower;
        in_stack_fffffffffffffed0 = (pBVar2->current_delta_offset).upper;
        previous_value.upper = (int64_t)src;
        previous_value.lower = uVar7;
        in_stack_fffffffffffffeb8 =
             DeltaDecode<duckdb::hugeint_t>(data,previous_value,in_stack_fffffffffffffed0);
        (pBVar2->current_delta_offset).lower = src[uVar5 - 1].lower;
        (pBVar2->current_delta_offset).upper = src[uVar5 - 1].upper;
      }
      else {
        in_stack_fffffffffffffea8 = (uhugeint_t *)(pBVar2->current_frame_of_reference).lower;
        in_stack_fffffffffffffeb0 = (uhugeint_t *)(pBVar2->current_frame_of_reference).upper;
        hVar6.upper = in_stack_fffffffffffffed0;
        hVar6.lower = in_stack_fffffffffffffec8;
        ApplyFrameOfReference<duckdb::hugeint_t>
                  ((hugeint_t *)in_stack_fffffffffffffeb8.upper,hVar6,
                   in_stack_fffffffffffffeb8.lower);
      }
      local_48 = uVar5 + local_48;
      pBVar2->current_group_offset = uVar5 + pBVar2->current_group_offset;
    }
  }
  return;
}

Assistant:

void BitpackingScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                           idx_t result_offset) {
	auto &scan_state = state.scan_state->Cast<BitpackingScanState<T>>();

	T *result_data = FlatVector::GetData<T>(result);
	result.SetVectorType(VectorType::FLAT_VECTOR);

	//! Because FOR offsets all our values to be 0 or above, we can always skip sign extension here
	bool skip_sign_extend = true;

	idx_t scanned = 0;
	while (scanned < scan_count) {
		D_ASSERT(scan_state.current_group_offset <= BITPACKING_METADATA_GROUP_SIZE);

		// Exhausted this metadata group, move pointers to next group and load metadata for next group.
		if (scan_state.current_group_offset == BITPACKING_METADATA_GROUP_SIZE) {
			scan_state.LoadNextGroup();
		}

		idx_t offset_in_compression_group =
		    scan_state.current_group_offset % BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE;

		if (scan_state.current_group.mode == BitpackingMode::CONSTANT) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *begin = result_data + result_offset + scanned;
			T *end = begin + remaining;
			std::fill(begin, end, scan_state.current_constant);
			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		if (scan_state.current_group.mode == BitpackingMode::CONSTANT_DELTA) {
			idx_t remaining = scan_count - scanned;
			idx_t to_scan = MinValue(remaining, BITPACKING_METADATA_GROUP_SIZE - scan_state.current_group_offset);
			T *target_ptr = result_data + result_offset + scanned;

			for (idx_t i = 0; i < to_scan; i++) {
				idx_t multiplier = scan_state.current_group_offset + i;
				// intended static casts to unsigned and back for defined wrapping of integers
				target_ptr[i] = static_cast<T>((static_cast<T_U>(scan_state.current_constant) * multiplier) +
				                               static_cast<T_U>(scan_state.current_frame_of_reference));
			}

			scanned += to_scan;
			scan_state.current_group_offset += to_scan;
			continue;
		}
		D_ASSERT(scan_state.current_group.mode == BitpackingMode::FOR ||
		         scan_state.current_group.mode == BitpackingMode::DELTA_FOR);

		idx_t to_scan = MinValue<idx_t>(scan_count - scanned, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE -
		                                                          offset_in_compression_group);
		// Calculate start of compression algorithm group
		data_ptr_t current_position_ptr =
		    scan_state.current_group_ptr + scan_state.current_group_offset * scan_state.current_width / 8;
		data_ptr_t decompression_group_start_pointer =
		    current_position_ptr - offset_in_compression_group * scan_state.current_width / 8;

		T *current_result_ptr = result_data + result_offset + scanned;

		if (to_scan == BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE && offset_in_compression_group == 0) {
			// Decompress directly into result vector
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(current_result_ptr), decompression_group_start_pointer,
			                                     scan_state.current_width, skip_sign_extend);
		} else {
			// Decompress compression algorithm to buffer
			BitpackingPrimitives::UnPackBlock<T>(data_ptr_cast(scan_state.decompression_buffer),
			                                     decompression_group_start_pointer, scan_state.current_width,
			                                     skip_sign_extend);

			memcpy(current_result_ptr, scan_state.decompression_buffer + offset_in_compression_group,
			       to_scan * sizeof(T));
		}

		if (scan_state.current_group.mode == BitpackingMode::DELTA_FOR) {
			ApplyFrameOfReference<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                           static_cast<T_S>(scan_state.current_frame_of_reference), to_scan);
			DeltaDecode<T_S>(reinterpret_cast<T_S *>(current_result_ptr),
			                 static_cast<T_S>(scan_state.current_delta_offset), to_scan);
			scan_state.current_delta_offset = current_result_ptr[to_scan - 1];
		} else {
			ApplyFrameOfReference<T>(current_result_ptr, scan_state.current_frame_of_reference, to_scan);
		}

		scanned += to_scan;
		scan_state.current_group_offset += to_scan;
	}
}